

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-app.h
# Opt level: O0

void __thiscall
mp::SolverApp<TestSolver,_TestNLReader2>::SolverApp(SolverApp<TestSolver,_TestNLReader2> *this)

{
  TestSolver *in_RDI;
  AppOutputHandler *this_00;
  undefined8 in_stack_ffffffffffffffb0;
  int flags;
  long in_stack_ffffffffffffffb8;
  BasicSolver *s;
  CStringRef long_name;
  CStringRef in_stack_ffffffffffffffd0;
  SolverAppOptionParser *this_01;
  BasicCStringRef<char> local_18;
  BasicCStringRef<char> local_10 [2];
  
  flags = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20);
  *(undefined4 *)&(in_RDI->super_Solver).super_BasicSolver.super_ErrorHandler._vptr_ErrorHandler = 0
  ;
  *(undefined4 *)
   ((long)&(in_RDI->super_Solver).super_BasicSolver.super_ErrorHandler._vptr_ErrorHandler + 4) = 0;
  long_name.data_ = (char *)&(in_RDI->super_Solver).super_BasicSolver.super_OutputHandler;
  fmt::BasicCStringRef<char>::BasicCStringRef(local_10,"testsolver");
  this_00 = (AppOutputHandler *)0x0;
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_18,(char *)0x0);
  TestSolver::TestSolver(in_RDI,in_stack_ffffffffffffffd0,long_name,in_stack_ffffffffffffffb8,flags)
  ;
  std::__cxx11::string::string
            ((string *)&in_RDI[1].super_Solver.super_BasicSolver.super_OutputHandler);
  std::__cxx11::string::string
            ((string *)&in_RDI[1].super_Solver.super_BasicSolver.super_SolverOptionManager);
  std::unique_ptr<StrictMockProblemBuilder,std::default_delete<StrictMockProblemBuilder>>::
  unique_ptr<std::default_delete<StrictMockProblemBuilder>,void>
            ((unique_ptr<StrictMockProblemBuilder,_std::default_delete<StrictMockProblemBuilder>_> *
             )this_00);
  s = (BasicSolver *)&in_RDI[1].super_Solver.super_BasicSolver.super_SolverOptionManager.options_;
  std::
  unique_ptr<mp::internal::SolverNLHandlerImpl<TestSolver,StrictMockProblemBuilder,mp::internal::NLProblemBuilder<StrictMockProblemBuilder>>,std::default_delete<mp::internal::SolverNLHandlerImpl<TestSolver,StrictMockProblemBuilder,mp::internal::NLProblemBuilder<StrictMockProblemBuilder>>>>
  ::
  unique_ptr<std::default_delete<mp::internal::SolverNLHandlerImpl<TestSolver,StrictMockProblemBuilder,mp::internal::NLProblemBuilder<StrictMockProblemBuilder>>>,void>
            ((unique_ptr<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>,_std::default_delete<mp::internal::SolverNLHandlerImpl<TestSolver,_StrictMockProblemBuilder,_mp::internal::NLProblemBuilder<StrictMockProblemBuilder>_>_>_>
              *)this_00);
  this_01 = (SolverAppOptionParser *)
            &in_RDI[1].super_Solver.super_BasicSolver.super_SolverOptionManager.options_._M_t.
             _M_impl.super__Rb_tree_header;
  internal::SignalHandler::SignalHandler((SignalHandler *)in_RDI,s);
  internal::SolverAppOptionParser::SolverAppOptionParser(this_01,(BasicSolver *)long_name.data_);
  in_RDI[1].super_Solver.super_BasicSolver.long_name_._M_string_length = 0;
  in_RDI[1].super_Solver.super_BasicSolver.long_name_.field_2._M_allocated_capacity = 0;
  *(undefined8 *)((long)&in_RDI[1].super_Solver.super_BasicSolver.long_name_.field_2 + 8) = 0;
  *(undefined8 *)&in_RDI[1].super_Solver.super_BasicSolver.exe_path_ = 0;
  AppOutputHandler::AppOutputHandler(this_00);
  BasicSolver::set_output_handler
            ((BasicSolver *)&(in_RDI->super_Solver).super_BasicSolver.super_OutputHandler,
             (OutputHandler *)&in_RDI[1].super_Solver.super_BasicSolver.exe_path_._M_string_length);
  return;
}

Assistant:

SolverApp() :
    sig_handler(solver_),
    option_parser_(solver_) {
    solver_.set_output_handler(&output_handler_);
  }